

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O3

bool __thiscall
vkt::shaderexecutor::BitfieldReverseCaseInstance::compare
          (BitfieldReverseCaseInstance *this,void **inputs,void **outputs)

{
  char cVar1;
  pointer pSVar2;
  uint uVar3;
  ostream *stream;
  ostringstream *this_00;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  Hex<8UL> local_28;
  
  pSVar2 = (this->super_IntegerFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  cVar1 = (&DAT_00b2ceb8)[(ulong)*(uint *)((long)&(pSVar2->varType).m_data + 4) * 4];
  uVar3 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  if (0 < (int)uVar3) {
    uVar4 = (2 << (cVar1 - 1U & 0x1f)) - 1;
    uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 * 0x1000000;
    uVar4 = (uVar4 & 0xf0f0f0f) << 4 | uVar4 >> 4 & 0xf0f0f0f;
    uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333) * 4;
    uVar6 = 0;
    bVar7 = false;
    do {
      uVar5 = *(uint *)((long)*inputs + uVar6 * 4);
      uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      uVar5 = (uVar5 & 0xf0f0f0f) << 4 | uVar5 >> 4 & 0xf0f0f0f;
      uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333) * 4;
      uVar5 = (uVar5 >> 1 & 0x55555555) + (uVar5 & 0x55555555) * 2;
      if (((*(uint *)((long)*outputs + uVar6 * 4) ^ uVar5) &
          (uVar4 >> 1 & 0x55555555) + (uVar4 & 0x55555555) * 2) != 0) {
        this_00 = &(this->super_IntegerFunctionTestInstance).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected [",10);
        stream = (ostream *)std::ostream::operator<<(this_00,(int)uVar6);
        std::__ostream_insert<char,std::char_traits<char>>(stream,"] = ",4);
        local_28.value = (deUint64)uVar5;
        tcu::Format::Hex<8UL>::toStream(&local_28,stream);
        return bVar7;
      }
      uVar6 = uVar6 + 1;
      bVar7 = uVar3 <= uVar6;
    } while (uVar6 != uVar3);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const deUint32			cmpMask			= reverseBits(getLowBitMask(integerLength));

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	value	= ((const deUint32*)inputs[0])[compNdx];
			const deInt32	out		= ((const deUint32*)outputs[0])[compNdx];
			const deUint32	ref		= reverseBits(value);

			if ((out&cmpMask) != (ref&cmpMask))
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(ref);
				return false;
			}
		}

		return true;
	}